

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

CopyResult
cmSystemTools::CopySingleFile
          (string *oldname,string *newname,CopyWhen when,CopyInputRecent inputRecent,string *err)

{
  bool bVar1;
  CopyStatus CVar2;
  string local_130;
  string local_110;
  Status local_f0;
  string local_e8;
  string local_c8;
  string local_a8;
  CopyStatus local_88;
  Status local_74;
  Kind local_6c;
  CopyStatus local_68;
  Status local_54;
  Kind local_4c;
  undefined1 local_48 [8];
  CopyStatus status;
  Status perms;
  mode_t perm;
  string *err_local;
  CopyInputRecent inputRecent_local;
  CopyWhen when_local;
  string *newname_local;
  string *oldname_local;
  
  unique0x10000330 = err;
  if (((when == Always) || (when != OnlyIfDifferent)) ||
     (bVar1 = cmsys::SystemTools::FilesDiffer(oldname,newname), bVar1)) {
    perms.Kind_ = Success;
    status._4_8_ = cmsys::SystemTools::GetPermissions(oldname,&perms.Kind_);
    bVar1 = cmsys::SystemTools::SameFile(oldname,newname);
    if (bVar1) {
      oldname_local._4_4_ = Success;
    }
    else {
      cmsys::SystemTools::CopyStatus::CopyStatus((CopyStatus *)local_48);
      CVar2 = cmsys::SystemTools::CloneFileContent(oldname,newname);
      local_68.super_Status = CVar2.super_Status;
      local_54 = local_68.super_Status;
      local_68.Path = CVar2.Path;
      local_4c = local_68.Path;
      local_48._0_4_ = local_68.super_Status.Kind_;
      local_48._4_4_ = local_68.super_Status.field_1;
      status.super_Status.Kind_ = local_68.Path;
      local_68 = CVar2;
      bVar1 = cmsys::Status::operator_cast_to_bool((Status *)local_48);
      if (!bVar1) {
        CVar2 = cmsys::SystemTools::CopyFileContentBlockwise(oldname,newname);
        local_88.super_Status = CVar2.super_Status;
        local_74 = local_88.super_Status;
        local_88.Path = CVar2.Path;
        local_6c = local_88.Path;
        local_48._0_4_ = local_88.super_Status.Kind_;
        local_48._4_4_ = local_88.super_Status.field_1;
        status.super_Status.Kind_ = local_88.Path;
        local_88 = CVar2;
      }
      bVar1 = cmsys::Status::operator_cast_to_bool((Status *)local_48);
      if (bVar1) {
        bVar1 = cmsys::Status::operator_cast_to_bool((Status *)&status.super_Status.field_1);
        if (bVar1) {
          local_f0 = cmsys::SystemTools::SetPermissions(newname,perms.Kind_,false);
          status._4_8_ = local_f0;
          bVar1 = cmsys::Status::operator_cast_to_bool((Status *)&status.super_Status.field_1);
          if (!bVar1) {
            if (stack0xffffffffffffffd0 != (string *)0x0) {
              cmsys::Status::GetString_abi_cxx11_(&local_130,(Status *)&status.super_Status.field_1)
              ;
              cmStrCat<std::__cxx11::string,char_const(&)[10]>
                        (&local_110,&local_130,(char (*) [10])" (output)");
              std::__cxx11::string::operator=
                        ((string *)stack0xffffffffffffffd0,(string *)&local_110);
              std::__cxx11::string::~string((string *)&local_110);
              std::__cxx11::string::~string((string *)&local_130);
            }
            return Failure;
          }
        }
        oldname_local._4_4_ = Success;
      }
      else {
        if (stack0xffffffffffffffd0 != (string *)0x0) {
          cmsys::Status::GetString_abi_cxx11_(&local_a8,(Status *)local_48);
          std::__cxx11::string::operator=((string *)stack0xffffffffffffffd0,(string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          if (status.super_Status.Kind_ == POSIX) {
            cmStrCat<std::__cxx11::string&,char_const(&)[9]>
                      (&local_c8,stack0xffffffffffffffd0,(char (*) [9])" (input)");
            std::__cxx11::string::operator=((string *)stack0xffffffffffffffd0,(string *)&local_c8);
            std::__cxx11::string::~string((string *)&local_c8);
          }
          else if (status.super_Status.Kind_ == 2) {
            cmStrCat<std::__cxx11::string&,char_const(&)[10]>
                      (&local_e8,stack0xffffffffffffffd0,(char (*) [10])" (output)");
            std::__cxx11::string::operator=((string *)stack0xffffffffffffffd0,(string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
          }
        }
        oldname_local._4_4_ = Failure;
      }
    }
  }
  else {
    oldname_local._4_4_ = Success;
  }
  return oldname_local._4_4_;
}

Assistant:

cmSystemTools::CopyResult cmSystemTools::CopySingleFile(
  std::string const& oldname, std::string const& newname, CopyWhen when,
  CopyInputRecent inputRecent, std::string* err)
{
  switch (when) {
    case CopyWhen::Always:
      break;
    case CopyWhen::OnlyIfDifferent:
      if (!FilesDiffer(oldname, newname)) {
        return CopyResult::Success;
      }
      break;
  }

  mode_t perm = 0;
  cmsys::Status perms = SystemTools::GetPermissions(oldname, perm);

  // If files are the same do not copy
  if (SystemTools::SameFile(oldname, newname)) {
    return CopyResult::Success;
  }

  cmsys::SystemTools::CopyStatus status;
  status = cmsys::SystemTools::CloneFileContent(oldname, newname);
  if (!status) {
    // if cloning did not succeed, fall back to blockwise copy
#ifdef _WIN32
    if (inputRecent == CopyInputRecent::Yes) {
      // Windows sometimes locks a file immediately after creation.
      // Retry a few times.
      WindowsFileRetry retry = cmSystemTools::GetWindowsFileRetry();
      while ((status =
                cmsys::SystemTools::CopyFileContentBlockwise(oldname, newname),
              status.Path == cmsys::SystemTools::CopyStatus::SourcePath &&
                status.GetPOSIX() == EACCES && --retry.Count)) {
        cmSystemTools::Delay(retry.Delay);
      }
    } else {
      status = cmsys::SystemTools::CopyFileContentBlockwise(oldname, newname);
    }
#else
    static_cast<void>(inputRecent);
    status = cmsys::SystemTools::CopyFileContentBlockwise(oldname, newname);
#endif
  }
  if (!status) {
    if (err) {
      *err = status.GetString();
      switch (status.Path) {
        case cmsys::SystemTools::CopyStatus::SourcePath:
          *err = cmStrCat(*err, " (input)");
          break;
        case cmsys::SystemTools::CopyStatus::DestPath:
          *err = cmStrCat(*err, " (output)");
          break;
        default:
          break;
      }
    }
    return CopyResult::Failure;
  }
  if (perms) {
    perms = SystemTools::SetPermissions(newname, perm);
    if (!perms) {
      if (err) {
        *err = cmStrCat(perms.GetString(), " (output)");
      }
      return CopyResult::Failure;
    }
  }
  return CopyResult::Success;
}